

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O1

TValue * trace_state(lua_State *L,lua_CFunction dummy,void *ud)

{
  byte *pbVar1;
  global_State *g;
  void *__dest;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  lua_State *plVar7;
  char *pcVar8;
  TValue *pTVar9;
  uint64_t uVar10;
  undefined8 *puVar11;
  int *piVar12;
  long lVar13;
  uint uVar14;
  BCPos BVar15;
  TValue *pTVar16;
  ushort *puVar17;
  uint64_t uVar18;
  ptrdiff_t pVar19;
  GCstr *pGVar20;
  cTValue *nextframe;
  long lVar21;
  int iVar22;
  undefined8 *puVar23;
  undefined8 *puVar24;
  ulong uVar25;
  GCfunc *fn;
  byte bVar26;
  double dVar27;
  int local_34;
  
  bVar26 = 0;
  g = (global_State *)((long)ud + -0x2e0);
LAB_001479ce:
  switch(*(undefined4 *)((long)ud + 0xec)) {
  case 0x11:
    goto switchD_001479e7_caseD_11;
  case 0x12:
switchD_001479e7_caseD_12:
    *(undefined4 *)((long)ud + 0xec) = 0x11;
    goto switchD_001479e7_caseD_11;
  case 0x13:
    *(undefined4 *)((long)ud + 0xec) = 0x11;
    trace_start((jit_State *)ud);
    lj_dispatch_update(g);
    if (*(int *)((long)ud + 0xec) == 0x12) goto switchD_001479e7_caseD_12;
    break;
  case 0x14:
    if (*(undefined4 **)((long)ud + 0xbd8) != (undefined4 *)0x0) {
      **(undefined4 **)((long)ud + 0xbd8) = *(undefined4 *)((long)ud + 0xbe0);
      *(undefined8 *)((long)ud + 0xbd8) = 0;
    }
    *(undefined4 *)((long)ud + 0x158) = 0;
    if ((((*(byte *)((long)ud + 0xaa) & 0x40) != 0) &&
        (*(short *)((long)ud + 0x6a) == *(short *)((long)ud + 0x68))) &&
       (*(int *)((long)ud + 0xfc) + *(int *)((long)ud + 0x100) == 0)) {
      *(undefined4 *)((long)ud + -0x228) = 0xfffffffa;
      lj_opt_dce((jit_State *)ud);
      iVar22 = lj_opt_loop((jit_State *)ud);
      if (iVar22 != 0) {
        *(undefined2 *)((long)ud + 0x6a) = 0;
        *(undefined1 *)((long)ud + 0x74) = 0;
        *(undefined4 *)((long)ud + 0x158) = *(undefined4 *)((long)ud + 0xc);
        *(undefined4 *)((long)ud + 0xec) = 0x11;
        break;
      }
      *(uint *)((long)ud + 0x158) = (uint)*(ushort *)((long)ud + 0x1b4);
    }
    lj_opt_sink((jit_State *)ud);
    if (*(int *)((long)ud + 0x158) == 0) {
      *(undefined1 *)(*(long *)((long)ud + 0x30) + -1 + (ulong)*(ushort *)((long)ud + 10) * 0xc) =
           0xff;
    }
    *(undefined4 *)((long)ud + 0xec) = 0x15;
    break;
  case 0x15:
    *(undefined4 *)((long)ud + -0x228) = 0xfffffff9;
    lj_asm_trace((jit_State *)ud,(GCtrace *)ud);
    uVar14 = *(uint *)((long)ud + 0x50);
    uVar2 = *(ushort *)((long)ud + 0x68);
    puVar11 = *(undefined8 **)((long)ud + 0x78);
    if (0x18 < (uVar14 & 0xff) - 0x41) goto switchD_0014805e_caseD_43;
    lVar21 = *(long *)((long)ud + 0x40);
    piVar12 = *(int **)((long)ud + 0x48);
    switch(uVar14 & 0xff) {
    case 0x41:
    case 0x42:
    case 0x45:
      *(ushort *)
       (*(long *)(*(long *)((long)ud + 0x180) + (ulong)*(uint *)((long)ud + 0xbcc) * 8) + 0x6a) =
           uVar2;
      break;
    case 0x46:
    case 0x4a:
    case 0x4b:
    case 0x4c:
      *piVar12 = (uint)*(byte *)(*(long *)((long)ud + 0x30) + 8) * 0x100 + (uint)uVar2 * 0x10000 +
                 0x57;
      goto LAB_001480a8;
    case 0x4f:
      *(char *)(piVar12 + ((ulong)(uVar14 >> 0x10) - 0x8000)) = 'N';
    case 0x52:
    case 0x55:
    case 0x59:
      *(char *)piVar12 = (char)uVar14 + '\x02';
      *(ushort *)((long)piVar12 + 2) = uVar2;
LAB_001480a8:
      *(undefined2 *)((long)ud + 0x6e) = *(undefined2 *)(lVar21 + 0x3e);
      *(ushort *)(lVar21 + 0x3e) = uVar2;
      break;
    case 0x58:
      lj_asm_patchexit((jit_State *)ud,
                       *(GCtrace **)
                        (*(long *)((long)ud + 0x180) + (ulong)*(uint *)((long)ud + 0xbc8) * 8),
                       *(ExitNo *)((long)ud + 0xbcc),*(MCode **)((long)ud + 0x58));
      lVar21 = *(long *)((long)ud + 0x180);
      lVar13 = *(long *)(*(long *)(lVar21 + (ulong)*(uint *)((long)ud + 0xbc8) * 8) + 0x30);
      uVar25 = (ulong)*(uint *)((long)ud + 0xbcc);
      *(undefined1 *)(lVar13 + 0xb + uVar25 * 0xc) = 0xff;
      if (*(byte *)(lVar13 + 9 + uVar25 * 0xc) < *(byte *)((long)ud + 0x73)) {
        *(byte *)(lVar13 + uVar25 * 0xc + 9) = *(byte *)((long)ud + 0x73);
      }
      lVar21 = *(long *)(lVar21 + (ulong)*(ushort *)((long)ud + 0x6c) * 8);
      *(short *)(lVar21 + 100) = *(short *)(lVar21 + 100) + 1;
      *(undefined2 *)((long)ud + 0x70) = *(undefined2 *)(lVar21 + 0x70);
      *(ushort *)(lVar21 + 0x70) = uVar2;
    }
switchD_0014805e_caseD_43:
    lj_mcode_commit((jit_State *)ud,*(MCode **)((long)ud + 0x58));
    *(undefined4 *)((long)ud + 0x174) = 0;
    iVar22 = *(int *)((long)ud + 0xc);
    iVar4 = *(int *)((long)ud + 0x28);
    puVar23 = (undefined8 *)ud;
    puVar24 = puVar11;
    for (lVar21 = 0xf; lVar21 != 0; lVar21 = lVar21 + -1) {
      *puVar24 = *puVar23;
      puVar23 = puVar23 + (ulong)bVar26 * -2 + 1;
      puVar24 = puVar24 + (ulong)bVar26 * -2 + 1;
    }
    *puVar11 = *(undefined8 *)((long)ud + -0x2b8);
    *(undefined8 **)((long)ud + -0x2b8) = puVar11;
    *(byte *)(puVar11 + 1) = *(byte *)((long)ud + -0x2c0) & 3;
    *(undefined1 *)((long)puVar11 + 9) = 9;
    puVar11[4] = puVar11 + (0xf - (ulong)*(uint *)((long)ud + 0x28));
    puVar23 = puVar11 + (ulong)(uint)(iVar22 - iVar4) + 0xf;
    puVar11[6] = puVar23;
    memcpy(puVar23,*(void **)((long)ud + 0x30),(ulong)*(ushort *)((long)ud + 10) * 0xc);
    __dest = (void *)((long)puVar23 + (ulong)*(ushort *)((long)ud + 10) * 0xc);
    puVar11[7] = __dest;
    memcpy(__dest,*(void **)((long)ud + 0x38),(ulong)*(uint *)((long)ud + 0x2c) << 2);
    *(undefined2 *)((long)ud + 0x68) = 0;
    *(undefined8 *)((long)ud + 0x78) = 0;
    uVar3 = *(ushort *)(puVar11 + 0xd);
    *(undefined8 **)(*(long *)((long)ud + 0x180) + (ulong)uVar3 * 8) = puVar11;
    lj_gc_barriertrace(g,(uint)uVar3);
    plVar7 = *(lua_State **)((long)ud + 0x80);
    if (((*(byte *)((plVar7->glref).ptr64 + 0x93) & 2) != 0) &&
       (pVar19 = lj_vmevent_prepare(plVar7,LJ_VMEVENT_TRACE), pVar19 != 0)) {
      pTVar16 = plVar7->top;
      plVar7->top = pTVar16 + 1;
      pGVar20 = lj_str_new(plVar7,"stop",4);
      pTVar16->u64 = (ulong)pGVar20 | 0xfffd800000000000;
      pTVar16 = plVar7->top;
      plVar7->top = pTVar16 + 1;
      pTVar16->n = (double)uVar2;
      pTVar16 = plVar7->top;
      plVar7->top = pTVar16 + 1;
      pTVar16->u64 = *(ulong *)((long)ud + 0x90) | 0xfffb800000000000;
      lj_vmevent_call(plVar7,pVar19);
    }
LAB_00148221:
    *(undefined4 *)((long)ud + -0x228) = 0xffffffff;
    *(undefined4 *)((long)ud + 0xec) = 0;
    lj_dispatch_update(g);
    return (TValue *)0x0;
  case 0x16:
    goto switchD_001479e7_caseD_16;
  default:
    pTVar16 = L->top;
    L->top = pTVar16 + 1;
    pTVar16->u64 = 0;
switchD_001479e7_caseD_16:
    if (*(undefined4 **)((long)ud + 0xbd8) != (undefined4 *)0x0) {
      **(undefined4 **)((long)ud + 0xbd8) = *(undefined4 *)((long)ud + 0xbe0);
      *(undefined8 *)((long)ud + 0xbd8) = 0;
    }
    plVar7 = *(lua_State **)((long)ud + 0x80);
    *(undefined4 *)((long)ud + 0x174) = 0;
    lj_mcode_abort((jit_State *)ud);
    if (*(GCtrace **)((long)ud + 0x78) != (GCtrace *)0x0) {
      lj_trace_free(g,*(GCtrace **)((long)ud + 0x78));
      *(undefined8 *)((long)ud + 0x78) = 0;
    }
    pTVar16 = plVar7->top + -1;
    iVar22 = 0;
    if (plVar7->top[-1].field_4.it >> 0xf < 0x1fff3) {
      iVar22 = (int)pTVar16->n;
    }
    if (iVar22 == 0x1d) {
      plVar7->top = pTVar16;
      *(undefined4 *)((long)ud + 0xec) = 0x15;
    }
    else {
      if ((*(int *)((long)ud + 0xbc8) == 0) && (*(byte *)((long)ud + 0x50) - 0x4d < 0xfffffffc)) {
        uVar14 = *(uint *)((long)ud + 0xbcc);
        if ((ulong)uVar14 == 0) {
          pcVar8 = *(char **)((long)ud + 0x48);
          if (iVar22 == 6) {
            *(undefined2 *)((long)ud + (ulong)((int)pcVar8 + 4U >> 1 & 0x7e) + 0xc48) = 1;
          }
          else {
            lVar21 = *(long *)((long)ud + 0x40);
            uVar25 = 0;
            puVar17 = (ushort *)((long)ud + 0x728);
            do {
              if (*(char **)(puVar17 + -4) == pcVar8) {
                uVar2 = *puVar17;
                uVar18 = lj_prng_u64((PRNGState *)((long)ud + 0xc28));
                uVar14 = ((uint)uVar18 & 0xf) + (uint)uVar2 * 2;
                if (uVar14 < 0xea61) goto LAB_00147d8c;
                if (*pcVar8 == 'F') {
                  *pcVar8 = 'E';
                  pcVar8[(ulong)*(ushort *)(pcVar8 + 6) * 4 + -0x1fffc] = 'X';
                }
                else {
                  *pcVar8 = *pcVar8 + '\x01';
                  pbVar1 = (byte *)(lVar21 + 0x3d);
                  *pbVar1 = *pbVar1 | 0x10;
                }
                goto LAB_00147db5;
              }
              uVar25 = uVar25 + 1;
              puVar17 = puVar17 + 8;
            } while (uVar25 != 0x40);
            uVar25 = (ulong)*(uint *)((long)ud + 0xb20);
            *(uint *)((long)ud + 0xb20) = *(uint *)((long)ud + 0xb20) + 1 & 0x3f;
            *(char **)((long)ud + uVar25 * 0x10 + 0x720) = pcVar8;
            uVar14 = 0x48;
LAB_00147d8c:
            lVar21 = (uVar25 & 0xffffffff) * 0x10;
            *(short *)((long)ud + lVar21 + 0x728) = (short)uVar14;
            *(short *)((long)ud + lVar21 + 0x72a) = (short)iVar22;
            *(short *)((long)ud + (ulong)((int)pcVar8 + 4U >> 1 & 0x7e) + 0xc48) = (short)uVar14;
          }
        }
        else {
          *(short *)(*(long *)(*(long *)((long)ud + 0x180) + (ulong)uVar14 * 8) + 0x6a) =
               (short)uVar14;
        }
      }
LAB_00147db5:
      uVar2 = *(ushort *)((long)ud + 0x68);
      if (uVar2 != 0) {
        pTVar16 = plVar7->top;
        uVar18 = (plVar7->stack).ptr64;
        *(undefined2 *)((long)ud + 0x6a) = 0;
        *(undefined1 *)((long)ud + 0x74) = 0;
        if (((*(byte *)((plVar7->glref).ptr64 + 0x93) & 2) != 0) &&
           (pVar19 = lj_vmevent_prepare(plVar7,LJ_VMEVENT_TRACE), pVar19 != 0)) {
          pTVar9 = plVar7->top;
          plVar7->top = pTVar9 + 1;
          pGVar20 = lj_str_new(plVar7,"abort",5);
          pTVar9->u64 = (ulong)pGVar20 | 0xfffd800000000000;
          pTVar9 = plVar7->top;
          plVar7->top = pTVar9 + 1;
          pTVar9->n = (double)uVar2;
          nextframe = lj_debug_frame(plVar7,0,&local_34);
          fn = (GCfunc *)(nextframe[-1].u64 & 0x7fffffffffff);
          if ((nextframe == plVar7->base + -1) && ((fn->c).ffid == '\0')) {
            BVar15 = (BCPos)(*(long *)((long)ud + 0x88) - (fn->c).pc.ptr64 >> 2);
          }
          else {
            BVar15 = lj_debug_framepc(plVar7,fn,nextframe);
          }
          pTVar9 = plVar7->top;
          plVar7->top = pTVar9 + 1;
          pTVar9->u64 = (ulong)fn | 0xfffb800000000000;
          pTVar9 = plVar7->top;
          plVar7->top = pTVar9 + 1;
          pTVar9->n = (double)(int)BVar15;
          pTVar9 = plVar7->top;
          uVar10 = (plVar7->stack).ptr64;
          plVar7->top = pTVar9 + 1;
          *pTVar9 = *(TValue *)((long)pTVar16 + uVar10 + (-8 - uVar18));
          pTVar16 = plVar7->top;
          plVar7->top = pTVar16 + 1;
          *pTVar16 = *(TValue *)((long)ud + 0xc10);
          lj_vmevent_call(plVar7,pVar19);
        }
        *(undefined8 *)(*(long *)((long)ud + 0x180) + (ulong)(uint)uVar2 * 8) = 0;
        if ((uint)uVar2 < *(uint *)((long)ud + 0x188)) {
          *(uint *)((long)ud + 0x188) = (uint)uVar2;
        }
        *(undefined2 *)((long)ud + 0x68) = 0;
      }
      plVar7->top = plVar7->top + -1;
      if (iVar22 != 0xe) {
        if (iVar22 == 0x1b) {
          lj_trace_flushall(plVar7);
        }
        goto LAB_00148221;
      }
      if (**(char **)((long)ud + 0x88) == 'I') goto LAB_00148221;
      *(undefined8 *)((long)ud + 0xbc8) = 0;
      *(undefined4 *)((long)ud + 0xec) = 0x11;
      trace_start((jit_State *)ud);
    }
    goto LAB_001479ce;
  }
LAB_00147cdf:
  if (*(uint *)((long)ud + 0xec) < 0x12) {
    return (TValue *)0x0;
  }
  goto LAB_001479ce;
switchD_001479e7_caseD_11:
  if (*(undefined4 **)((long)ud + 0xbd8) != (undefined4 *)0x0) {
    if (*(char *)((long)ud + 0xb7) == '\0') {
      **(undefined4 **)((long)ud + 0xbd8) = *(undefined4 *)((long)ud + 0xbe0);
      *(undefined8 *)((long)ud + 0xbd8) = 0;
    }
    else {
      *(undefined1 *)((long)ud + 0xb7) = 0;
    }
  }
  *(undefined4 *)((long)ud + -0x228) = 0xfffffffb;
  if (((*(byte *)((L->glref).ptr64 + 0x93) & 4) != 0) &&
     (pVar19 = lj_vmevent_prepare(L,LJ_VMEVENT_RECORD), pVar19 != 0)) {
    uVar5 = *(undefined8 *)((long)ud + -0x1f8);
    uVar6 = *(undefined8 *)((long)ud + -0x1f0);
    pTVar16 = L->top;
    L->top = pTVar16 + 1;
    pTVar16->n = (double)*(ushort *)((long)ud + 0x68);
    pTVar16 = L->top;
    L->top = pTVar16 + 1;
    pTVar16->u64 = *(ulong *)((long)ud + 0x90) | 0xfffb800000000000;
    pTVar16 = L->top;
    L->top = pTVar16 + 1;
    dVar27 = -1.0;
    if (*(long *)((long)ud + 0x98) != 0) {
      dVar27 = (double)(int)((*(long *)((long)ud + 0x88) - *(long *)((long)ud + 0x98)) - 0x68U >> 2)
      ;
    }
    pTVar16->u64 = (uint64_t)dVar27;
    pTVar16 = L->top;
    L->top = pTVar16 + 1;
    pTVar16->n = (double)*(int *)((long)ud + 0xfc);
    lj_vmevent_call(L,pVar19);
    *(undefined8 *)((long)ud + -0x1f8) = uVar5;
    *(undefined8 *)((long)ud + -0x1f0) = uVar6;
  }
  lj_record_ins((jit_State *)ud);
  goto LAB_00147cdf;
}

Assistant:

static TValue *trace_state(lua_State *L, lua_CFunction dummy, void *ud)
{
  jit_State *J = (jit_State *)ud;
  UNUSED(dummy);
  do {
  retry:
    switch (J->state) {
    case LJ_TRACE_START:
      J->state = LJ_TRACE_RECORD;  /* trace_start() may change state. */
      trace_start(J);
      lj_dispatch_update(J2G(J));
      if (J->state != LJ_TRACE_RECORD_1ST)
	break;
      /* fallthrough */

    case LJ_TRACE_RECORD_1ST:
      J->state = LJ_TRACE_RECORD;
      /* fallthrough */
    case LJ_TRACE_RECORD:
      trace_pendpatch(J, 0);
      setvmstate(J2G(J), RECORD);
      lj_vmevent_send_(L, RECORD,
	/* Save/restore tmptv state for trace recorder. */
	TValue savetv = J2G(J)->tmptv;
	TValue savetv2 = J2G(J)->tmptv2;
	setintV(L->top++, J->cur.traceno);
	setfuncV(L, L->top++, J->fn);
	setintV(L->top++, J->pt ? (int32_t)proto_bcpos(J->pt, J->pc) : -1);
	setintV(L->top++, J->framedepth);
      ,
	J2G(J)->tmptv = savetv;
	J2G(J)->tmptv2 = savetv2;
      );
      lj_record_ins(J);
      break;

    case LJ_TRACE_END:
      trace_pendpatch(J, 1);
      J->loopref = 0;
      if ((J->flags & JIT_F_OPT_LOOP) &&
	  J->cur.link == J->cur.traceno && J->framedepth + J->retdepth == 0) {
	setvmstate(J2G(J), OPT);
	lj_opt_dce(J);
	if (lj_opt_loop(J)) {  /* Loop optimization failed? */
	  J->cur.link = 0;
	  J->cur.linktype = LJ_TRLINK_NONE;
	  J->loopref = J->cur.nins;
	  J->state = LJ_TRACE_RECORD;  /* Try to continue recording. */
	  break;
	}
	J->loopref = J->chain[IR_LOOP];  /* Needed by assembler. */
      }
      lj_opt_split(J);
      lj_opt_sink(J);
      if (!J->loopref) J->cur.snap[J->cur.nsnap-1].count = SNAPCOUNT_DONE;
      J->state = LJ_TRACE_ASM;
      break;

    case LJ_TRACE_ASM:
      setvmstate(J2G(J), ASM);
      lj_asm_trace(J, &J->cur);
      trace_stop(J);
      setvmstate(J2G(J), INTERP);
      J->state = LJ_TRACE_IDLE;
      lj_dispatch_update(J2G(J));
      return NULL;

    default:  /* Trace aborted asynchronously. */
      setintV(L->top++, (int32_t)LJ_TRERR_RECERR);
      /* fallthrough */
    case LJ_TRACE_ERR:
      trace_pendpatch(J, 1);
      if (trace_abort(J))
	goto retry;
      setvmstate(J2G(J), INTERP);
      J->state = LJ_TRACE_IDLE;
      lj_dispatch_update(J2G(J));
      return NULL;
    }
  } while (J->state > LJ_TRACE_RECORD);
  return NULL;
}